

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbuf.cc
# Opt level: O0

void __thiscall bsplib::Unbuf::start(Unbuf *this)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  MPI_Comm poVar5;
  size_type sVar6;
  size_type sVar7;
  Entry *pEVar8;
  reference pvVar9;
  unsigned_long *puVar10;
  reference ppoVar11;
  int tag_1;
  char *next_addr_1;
  char *addr_1;
  size_t size_1;
  Entry *u_1;
  size_t i_1;
  int tag;
  char *next_addr;
  char *addr;
  size_t size;
  Entry *u;
  size_t i;
  size_t j;
  Unbuf *this_local;
  
  sVar6 = std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::size
                    (&this->m_sends);
  sVar7 = std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::size
                    (&this->m_recvs);
  std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::resize
            (&this->m_reqs,sVar6 + sVar7);
  i = 0;
  u = (Entry *)0x0;
  while( true ) {
    pEVar8 = (Entry *)std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::size
                                (&this->m_recvs);
    if (pEVar8 <= u) break;
    pvVar9 = std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::operator[]
                       (&this->m_recvs,(size_type)u);
    puVar10 = std::min<unsigned_long>(&this->m_max_msg_size,&pvVar9->size);
    uVar3 = *puVar10;
    pcVar4 = pvVar9->addr;
    pvVar9->addr = pcVar4 + uVar3;
    pvVar9->size = pvVar9->size - uVar3;
    iVar1 = pvVar9->tag;
    iVar2 = pvVar9->pid;
    poVar5 = this->m_comm;
    ppoVar11 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::operator[]
                         (&this->m_reqs,i);
    MPI_Irecv(pcVar4,uVar3 & 0xffffffff,&ompi_mpi_byte,iVar2,iVar1,poVar5,ppoVar11);
    i = i + 1;
    u = (Entry *)((long)&u->pid + 1);
  }
  MPI_Barrier(this->m_comm);
  u_1 = (Entry *)0x0;
  while( true ) {
    pEVar8 = (Entry *)std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::size
                                (&this->m_sends);
    if (pEVar8 <= u_1) break;
    pvVar9 = std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::operator[]
                       (&this->m_sends,(size_type)u_1);
    puVar10 = std::min<unsigned_long>(&this->m_max_msg_size,&pvVar9->size);
    uVar3 = *puVar10;
    pcVar4 = pvVar9->addr;
    pvVar9->addr = pcVar4 + uVar3;
    pvVar9->size = pvVar9->size - uVar3;
    iVar1 = pvVar9->tag;
    iVar2 = pvVar9->pid;
    poVar5 = this->m_comm;
    ppoVar11 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::operator[]
                         (&this->m_reqs,i);
    MPI_Irsend(pcVar4,uVar3 & 0xffffffff,&ompi_mpi_byte,iVar2,iVar1,poVar5,ppoVar11);
    i = i + 1;
    u_1 = (Entry *)((long)&u_1->pid + 1);
  }
  sVar6 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::size(&this->m_reqs);
  std::vector<int,_std::allocator<int>_>::resize(&this->m_ready,sVar6);
  return;
}

Assistant:

void Unbuf :: start( )
{
   m_reqs.resize( m_sends.size() + m_recvs.size() );
   size_t j = 0;
   for ( size_t i = 0 ; i < m_recvs.size(); ++j, ++i ) {
       Entry & u = m_recvs[i];
       size_t size = std::min( m_max_msg_size, u.size );
       char * addr = const_cast<char *>( u.addr );
       char * next_addr = addr + size;
       u.addr = next_addr;
       u.size -= size;
       const int tag = u.tag;
       MPI_Irecv( addr, int(size), MPI_BYTE, u.pid, tag, m_comm, &m_reqs[j]);
   }

   MPI_Barrier( m_comm ); // so we can use ready sends

   for ( size_t i = 0 ; i < m_sends.size(); ++j, ++i ) {
       Entry & u = m_sends[i];
       size_t size = std::min( m_max_msg_size, u.size );
       char * addr = const_cast<char *>( u.addr );
       char * next_addr = addr + size;
       u.addr = next_addr;
       u.size -= size;
       const int tag = u.tag;
       MPI_Irsend( addr, int(size), MPI_BYTE, u.pid, tag, m_comm, &m_reqs[j]);
   }

   m_ready.resize( m_reqs.size() );
}